

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

bool __thiscall draco::ObjDecoder::ParseMaterialFileDefinition(ObjDecoder *this,Status *param_1)

{
  DecoderBuffer *buffer;
  int iVar1;
  long lVar2;
  bool bVar3;
  mapped_type *pmVar4;
  bool bVar5;
  string str;
  string local_38;
  
  buffer = &this->buffer_;
  parser::SkipWhitespace(buffer);
  lVar2 = (this->buffer_).pos_;
  if ((this->buffer_).data_size_ < lVar2 + 1) {
    return false;
  }
  if (buffer->data_[lVar2] == '#') {
    parser::SkipLine(buffer);
    return true;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  bVar3 = parser::ParseString(buffer,&local_38);
  if (bVar3) {
    bVar3 = std::operator==(&local_38,"newmtl");
    bVar5 = true;
    if (!bVar3) goto LAB_0010da9f;
    parser::SkipWhitespace(buffer);
    parser::ParseLine(buffer,&local_38);
    if (local_38._M_string_length != 0) {
      iVar1 = this->num_materials_;
      this->num_materials_ = iVar1 + 1;
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->material_name_to_id_,&local_38);
      *pmVar4 = iVar1;
      goto LAB_0010da9f;
    }
  }
  bVar5 = false;
LAB_0010da9f:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar5;
}

Assistant:

bool ObjDecoder::ParseMaterialFileDefinition(Status * /* status */) {
  char c;
  parser::SkipWhitespace(buffer());
  if (!buffer()->Peek(&c)) {
    // End of file reached?.
    return false;
  }
  if (c == '#') {
    // Comment, ignore the line.
    parser::SkipLine(buffer());
    return true;
  }
  std::string str;
  if (!parser::ParseString(buffer(), &str)) {
    return false;
  }
  if (str == "newmtl") {
    parser::SkipWhitespace(buffer());
    parser::ParseLine(buffer(), &str);
    if (str.empty()) {
      return false;
    }
    // Add new material to our map.
    material_name_to_id_[str] = num_materials_++;
  }
  return true;
}